

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JsonReporter::testCasePartialEnded
          (JsonReporter *this,TestCaseStats *tcStats,uint64_t param_3)

{
  ulong uVar1;
  reference pvVar2;
  JsonValueWriter *this_00;
  JsonReporter *this_01;
  StringRef SVar3;
  JsonObjectWriter totals;
  JsonValueWriter *in_stack_fffffffffffff8c8;
  JsonReporter *in_stack_fffffffffffff8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d8;
  JsonValueWriter *in_stack_fffffffffffff8e0;
  char *local_6f8;
  size_t local_6f0;
  JsonObjectWriter local_6e8 [18];
  StringRef local_538;
  JsonObjectWriter local_528 [17];
  undefined1 local_390 [24];
  StringRef local_378;
  JsonObjectWriter local_368 [17];
  StringRef local_1c0;
  JsonObjectWriter local_1b0 [15];
  Counts *in_stack_ffffffffffffffb8;
  JsonObjectWriter *in_stack_ffffffffffffffc0;
  
  endArray(in_stack_fffffffffffff8d0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pvVar2 = std::
             stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
             ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                    *)0x1a4a5b);
    local_1c0 = operator____sr((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
    JsonObjectWriter::write(local_1b0,(int)pvVar2,local_1c0.m_start,local_1c0.m_size);
    JsonValueWriter::write<std::__cxx11::string>
              (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4acd);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = (JsonValueWriter *)
              std::
              stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
              ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                     *)0x1a4b1f);
    local_378 = operator____sr((char *)in_stack_fffffffffffff8d0,(size_t)in_stack_fffffffffffff8c8);
    JsonObjectWriter::write(local_368,(int)this_00,local_378.m_start,local_378.m_size);
    JsonValueWriter::write<std::__cxx11::string>(this_00,in_stack_fffffffffffff8d8);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4b91);
  }
  this_01 = (JsonReporter *)
            std::
            stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
            ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                   *)0x1a4bca);
  local_538 = operator____sr((char *)this_01,(size_t)in_stack_fffffffffffff8c8);
  JsonObjectWriter::write(local_528,(int)this_01,local_538.m_start,local_538.m_size);
  JsonValueWriter::writeObject(in_stack_fffffffffffff8c8);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4c38);
  SVar3 = operator____sr((char *)this_01,(size_t)in_stack_fffffffffffff8c8);
  local_6f8 = SVar3.m_start;
  local_6f0 = SVar3.m_size;
  JsonObjectWriter::write(local_6e8,(int)local_390,local_6f8,local_6f0);
  JsonValueWriter::writeObject(in_stack_fffffffffffff8c8);
  writeCounts(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_01);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a4cb7);
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_01);
  endObject(this_01);
  return;
}

Assistant:

void JsonReporter::testCasePartialEnded( TestCaseStats const& tcStats,
                                             uint64_t /*index*/ ) {
        // Fixme: the top level section handles this.
        //// path object
        endArray();
        if ( !tcStats.stdOut.empty() ) {
            m_objectWriters.top()
                .write( "captured-stdout"_sr )
                .write( tcStats.stdOut );
        }
        if ( !tcStats.stdErr.empty() ) {
            m_objectWriters.top()
                .write( "captured-stderr"_sr )
                .write( tcStats.stdErr );
        }
        {
            auto totals =
                m_objectWriters.top().write( "totals"_sr ).writeObject();
            writeCounts( totals.write( "assertions"_sr ).writeObject(),
                         tcStats.totals.assertions );
            // We do not write the test case totals, because there will
            // always be just one test case here.
            // TODO: overall "result" -> success, skip, fail here? Or in
            // partial result?
        }
        // TODO: aborting?
        // run object
        endObject();
    }